

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O0

CURLcode Curl_sasl_continue(SASL *sasl,connectdata *conn,int code,saslprogress *progress)

{
  size_t local_70;
  size_t len;
  size_t chlglen;
  char *chlg;
  char *serverdata;
  char *resp;
  SessionHandle *pSStack_40;
  saslstate newstate;
  SessionHandle *data;
  saslprogress *psStack_30;
  CURLcode result;
  saslprogress *progress_local;
  connectdata *pcStack_20;
  int code_local;
  connectdata *conn_local;
  SASL *sasl_local;
  
  data._4_4_ = CURLE_OK;
  pSStack_40 = conn->data;
  resp._4_4_ = SASL_FINAL;
  serverdata = (char *)0x0;
  chlglen = 0;
  len = 0;
  local_70 = 0;
  *progress = SASL_INPROGRESS;
  psStack_30 = progress;
  progress_local._4_4_ = code;
  pcStack_20 = conn;
  conn_local = (connectdata *)sasl;
  if (sasl->state == SASL_FINAL) {
    if (code != sasl->params->finalcode) {
      data._4_4_ = CURLE_LOGIN_DENIED;
    }
    *progress = SASL_DONE;
    state(sasl,conn,SASL_STOP);
    sasl_local._4_4_ = data._4_4_;
  }
  else if ((sasl->state == SASL_CANCEL) || (code == sasl->params->contcode)) {
    switch(sasl->state) {
    case SASL_STOP:
      *progress = SASL_DONE;
      return CURLE_OK;
    case SASL_PLAIN:
      data._4_4_ = sasl_create_plain_message
                             (pSStack_40,conn->user,conn->passwd,&serverdata,&local_70);
      break;
    case SASL_LOGIN:
      data._4_4_ = sasl_create_login_message(pSStack_40,conn->user,&serverdata,&local_70);
      resp._4_4_ = SASL_LOGIN_PASSWD;
      break;
    case SASL_LOGIN_PASSWD:
      data._4_4_ = sasl_create_login_message(pSStack_40,conn->passwd,&serverdata,&local_70);
      break;
    case SASL_EXTERNAL:
      data._4_4_ = sasl_create_external_message(pSStack_40,conn->user,&serverdata,&local_70);
      break;
    case SASL_CRAMMD5:
      (*sasl->params->getmessage)((pSStack_40->state).buffer,&chlg);
      data._4_4_ = sasl_decode_cram_md5_message(chlg,(char **)&chlglen,&len);
      if (data._4_4_ == CURLE_OK) {
        data._4_4_ = sasl_create_cram_md5_message
                               (pSStack_40,(char *)chlglen,pcStack_20->user,pcStack_20->passwd,
                                &serverdata,&local_70);
      }
      (*Curl_cfree)((void *)chlglen);
      break;
    case SASL_DIGESTMD5:
      (*sasl->params->getmessage)((pSStack_40->state).buffer,&chlg);
      data._4_4_ = Curl_sasl_create_digest_md5_message
                             (pSStack_40,chlg,pcStack_20->user,pcStack_20->passwd,
                              (char *)conn_local->data->next,&serverdata,&local_70);
      resp._4_4_ = SASL_DIGESTMD5_RESP;
      break;
    case SASL_DIGESTMD5_RESP:
      serverdata = (*Curl_cstrdup)("");
      if (serverdata == (char *)0x0) {
        data._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      break;
    default:
      Curl_failf(pSStack_40,"Unsupported SASL authentication mechanism");
      data._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
      break;
    case SASL_XOAUTH2:
      data._4_4_ = sasl_create_xoauth2_message
                             (pSStack_40,conn->user,conn->xoauth2_bearer,&serverdata,&local_70);
      break;
    case SASL_CANCEL:
      sasl->authmechs = sasl->authused ^ sasl->authmechs;
      data._4_4_ = Curl_sasl_start(sasl,conn,(_Bool)(sasl->force_ir & 1),progress);
      resp._4_4_ = *(saslstate *)(conn_local->chunk).hexbuffer;
    }
    if (data._4_4_ == CURLE_OK) {
      if (serverdata != (char *)0x0) {
        data._4_4_ = (**(code **)&(conn_local->data->msg).extmsg)(pcStack_20,serverdata);
      }
    }
    else if (data._4_4_ == CURLE_BAD_CONTENT_ENCODING) {
      data._4_4_ = (**(code **)&(conn_local->data->msg).extmsg)(pcStack_20,"*");
      resp._4_4_ = SASL_CANCEL;
    }
    else {
      resp._4_4_ = SASL_STOP;
      *psStack_30 = SASL_DONE;
    }
    (*Curl_cfree)(serverdata);
    state((SASL *)conn_local,pcStack_20,resp._4_4_);
    sasl_local._4_4_ = data._4_4_;
  }
  else {
    *progress = SASL_DONE;
    state(sasl,conn,SASL_STOP);
    sasl_local._4_4_ = CURLE_LOGIN_DENIED;
  }
  return sasl_local._4_4_;
}

Assistant:

CURLcode Curl_sasl_continue(struct SASL *sasl, struct connectdata *conn,
                            int code, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  saslstate newstate = SASL_FINAL;
  char *resp = NULL;
#if !defined(CURL_DISABLE_CRYPTO_AUTH)
  char *serverdata;
  char *chlg = NULL;
  size_t chlglen = 0;
#endif
  size_t len = 0;

  *progress = SASL_INPROGRESS;

  if(sasl->state == SASL_FINAL) {
    if(code != sasl->params->finalcode)
      result = CURLE_LOGIN_DENIED;
    *progress = SASL_DONE;
    state(sasl, conn, SASL_STOP);
    return result;
  }

  if(sasl->state != SASL_CANCEL && code != sasl->params->contcode) {
    *progress = SASL_DONE;
    state(sasl, conn, SASL_STOP);
    return CURLE_LOGIN_DENIED;
  }

  switch(sasl->state) {
  case SASL_STOP:
    *progress = SASL_DONE;
    return result;
  case SASL_PLAIN:
    result = sasl_create_plain_message(data, conn->user, conn->passwd, &resp,
                                       &len);
    break;
  case SASL_LOGIN:
    result = sasl_create_login_message(data, conn->user, &resp, &len);
    newstate = SASL_LOGIN_PASSWD;
    break;
  case SASL_LOGIN_PASSWD:
    result = sasl_create_login_message(data, conn->passwd, &resp, &len);
    break;
  case SASL_EXTERNAL:
    result = sasl_create_external_message(data, conn->user, &resp, &len);
    break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
  case SASL_CRAMMD5:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = sasl_decode_cram_md5_message(serverdata, &chlg, &chlglen);
    if(!result)
      result = sasl_create_cram_md5_message(data, chlg, conn->user,
                                            conn->passwd, &resp, &len);
    free(chlg);
    break;
  case SASL_DIGESTMD5:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = Curl_sasl_create_digest_md5_message(data, serverdata,
                                                 conn->user, conn->passwd,
                                                 sasl->params->service,
                                                 &resp, &len);
    newstate = SASL_DIGESTMD5_RESP;
    break;
  case SASL_DIGESTMD5_RESP:
    if(!(resp = strdup("")))
      result = CURLE_OUT_OF_MEMORY;
    break;
#endif

#ifdef USE_NTLM
  case SASL_NTLM:
    /* Create the type-1 message */
    result = Curl_sasl_create_ntlm_type1_message(conn->user, conn->passwd,
                                                 &conn->ntlm, &resp, &len);
    newstate = SASL_NTLM_TYPE2MSG;
    break;
  case SASL_NTLM_TYPE2MSG:
    /* Decode the type-2 message */
    sasl->params->getmessage(data->state.buffer, &serverdata);
    result = Curl_sasl_decode_ntlm_type2_message(data, serverdata,
                                                 &conn->ntlm);
    if(!result)
      result = Curl_sasl_create_ntlm_type3_message(data, conn->user,
                                                   conn->passwd, &conn->ntlm,
                                                   &resp, &len);
    break;
#endif

#if defined(USE_KERBEROS5)
  case SASL_GSSAPI:
    result = Curl_sasl_create_gssapi_user_message(data, conn->user,
                                                  conn->passwd,
                                                  sasl->params->service,
                                                  sasl->mutual_auth, NULL,
                                                  &conn->krb5,
                                                  &resp, &len);
    newstate = SASL_GSSAPI_TOKEN;
    break;
  case SASL_GSSAPI_TOKEN:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    if(sasl->mutual_auth) {
      /* Decode the user token challenge and create the optional response
         message */
      result = Curl_sasl_create_gssapi_user_message(data, NULL, NULL, NULL,
                                                    sasl->mutual_auth,
                                                    serverdata, &conn->krb5,
                                                    &resp, &len);
      newstate = SASL_GSSAPI_NO_DATA;
    }
    else
      /* Decode the security challenge and create the response message */
      result = Curl_sasl_create_gssapi_security_message(data, serverdata,
                                                        &conn->krb5,
                                                        &resp, &len);
    break;
  case SASL_GSSAPI_NO_DATA:
    sasl->params->getmessage(data->state.buffer, &serverdata);
    /* Decode the security challenge and create the response message */
    result = Curl_sasl_create_gssapi_security_message(data, serverdata,
                                                      &conn->krb5,
                                                      &resp, &len);
    break;
#endif

  case SASL_XOAUTH2:
    /* Create the authorisation message */
    result = sasl_create_xoauth2_message(data, conn->user,
                                         conn->xoauth2_bearer, &resp, &len);
    break;
  case SASL_CANCEL:
    /* Remove the offending mechanism from the supported list */
    sasl->authmechs ^= sasl->authused;

    /* Start an alternative SASL authentication */
    result = Curl_sasl_start(sasl, conn, sasl->force_ir, progress);
    newstate = sasl->state;   /* Use state from Curl_sasl_start() */
    break;
  default:
    failf(data, "Unsupported SASL authentication mechanism");
    result = CURLE_UNSUPPORTED_PROTOCOL;  /* Should not happen */
    break;
  }

  switch(result) {
  case CURLE_BAD_CONTENT_ENCODING:
    /* Cancel dialog */
    result = sasl->params->sendcont(conn, "*");
    newstate = SASL_CANCEL;
    break;
  case CURLE_OK:
    if(resp)
      result = sasl->params->sendcont(conn, resp);
    break;
  default:
    newstate = SASL_STOP;    /* Stop on error */
    *progress = SASL_DONE;
    break;
  }

  free(resp);

  state(sasl, conn, newstate);

  return result;
}